

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O0

void __thiscall cmDepends::SetIncludePathFromLanguage(cmDepends *this,string *lang)

{
  char *pcVar1;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  cmMakefile *local_60;
  cmMakefile *mf;
  allocator local_41;
  undefined1 local_40 [8];
  string includePathVar;
  char *includePath;
  string *lang_local;
  cmDepends *this_local;
  
  includePathVar.field_2._8_8_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,"CMAKE_",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::__cxx11::string::operator+=((string *)local_40,(string *)lang);
  std::__cxx11::string::operator+=((string *)local_40,"_TARGET_INCLUDE_PATH");
  local_60 = cmLocalGenerator::GetMakefile(this->LocalGenerator);
  pcVar1 = cmMakefile::GetDefinition(local_60,(string *)local_40);
  includePathVar.field_2._8_8_ = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::operator=((string *)local_40,"CMAKE_");
    std::__cxx11::string::operator+=((string *)local_40,(string *)lang);
    std::__cxx11::string::operator+=((string *)local_40,"_INCLUDE_PATH");
    pcVar1 = cmMakefile::GetDefinition(local_60,(string *)local_40);
    includePathVar.field_2._8_8_ = pcVar1;
    if (pcVar1 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a8,pcVar1,&local_a9);
      cmSystemTools::ExpandListArgument(&local_a8,&this->IncludePath,false);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,pcVar1,&local_81);
    cmSystemTools::ExpandListArgument(&local_80,&this->IncludePath,false);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmDepends::SetIncludePathFromLanguage(const std::string& lang)
{
  // Look for the new per "TARGET_" variant first:
  const char* includePath = CM_NULLPTR;
  std::string includePathVar = "CMAKE_";
  includePathVar += lang;
  includePathVar += "_TARGET_INCLUDE_PATH";
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  includePath = mf->GetDefinition(includePathVar);
  if (includePath) {
    cmSystemTools::ExpandListArgument(includePath, this->IncludePath);
  } else {
    // Fallback to the old directory level variable if no per-target var:
    includePathVar = "CMAKE_";
    includePathVar += lang;
    includePathVar += "_INCLUDE_PATH";
    includePath = mf->GetDefinition(includePathVar);
    if (includePath) {
      cmSystemTools::ExpandListArgument(includePath, this->IncludePath);
    }
  }
}